

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

int If_ManSortCompare(If_Man_t *p,If_Cut_t *pC0,If_Cut_t *pC1)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  iVar1 = p->SortMode;
  if (p->pPars->fPower == 0) {
    if (iVar1 == 0) {
      fVar4 = p->fEpsilon;
      if (pC0->Delay < pC1->Delay - fVar4) {
        return -1;
      }
      if (pC1->Delay + fVar4 < pC0->Delay) {
        return 1;
      }
      uVar2 = *(uint *)&pC0->field_0x1c >> 0x18;
      uVar3 = *(uint *)&pC1->field_0x1c >> 0x18;
      if (uVar2 < uVar3) {
        return -1;
      }
      if (uVar3 < uVar2) {
        return 1;
      }
      if (pC0->Area < pC1->Area - fVar4) {
        return -1;
      }
      if (pC1->Area + fVar4 < pC0->Area) {
        return 1;
      }
      if (pC0->Edge < pC1->Edge - fVar4) {
        return -1;
      }
      if (pC1->Edge + fVar4 < pC0->Edge) {
        return 1;
      }
      fVar5 = pC0->Power;
      fVar6 = pC1->Power;
      goto LAB_0030f233;
    }
    if (iVar1 == 2) {
      fVar4 = p->fEpsilon;
      if (pC0->Delay < pC1->Delay - fVar4) {
        return -1;
      }
      if (pC1->Delay + fVar4 < pC0->Delay) {
        return 1;
      }
      if (pC0->Area < pC1->Area - fVar4) {
        return -1;
      }
      if (pC1->Area + fVar4 < pC0->Area) {
        return 1;
      }
      if (pC0->Edge < pC1->Edge - fVar4) {
        return -1;
      }
      if (pC1->Edge + fVar4 < pC0->Edge) {
        return 1;
      }
      fVar5 = pC0->Power;
      fVar6 = pC1->Power;
      goto LAB_0030f17b;
    }
    if (iVar1 != 1) {
      __assert_fail("p->SortMode == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCut.c"
                    ,0x27d,"int If_ManSortCompare(If_Man_t *, If_Cut_t *, If_Cut_t *)");
    }
    fVar4 = p->fEpsilon;
    if (pC0->Area < pC1->Area - fVar4) {
      return -1;
    }
    if (pC1->Area + fVar4 < pC0->Area) {
      return 1;
    }
    if (pC0->Edge < pC1->Edge - fVar4) {
      return -1;
    }
    if (pC1->Edge + fVar4 < pC0->Edge) {
      return 1;
    }
    fVar5 = pC0->Power;
    fVar6 = pC1->Power;
  }
  else {
    if (iVar1 == 0) {
      fVar4 = p->fEpsilon;
      if (pC0->Delay < pC1->Delay - fVar4) {
        return -1;
      }
      if (pC1->Delay + fVar4 < pC0->Delay) {
        return 1;
      }
      uVar2 = *(uint *)&pC0->field_0x1c >> 0x18;
      uVar3 = *(uint *)&pC1->field_0x1c >> 0x18;
      if (uVar2 < uVar3) {
        return -1;
      }
      if (uVar3 < uVar2) {
        return 1;
      }
      if (pC0->Area < pC1->Area - fVar4) {
        return -1;
      }
      if (pC1->Area + fVar4 < pC0->Area) {
        return 1;
      }
      if (pC0->Power < pC1->Power - fVar4) {
        return -1;
      }
      if (pC1->Power + fVar4 < pC0->Power) {
        return 1;
      }
      fVar5 = pC0->Edge;
      fVar6 = pC1->Edge;
      goto LAB_0030f233;
    }
    if (iVar1 == 2) {
      fVar4 = p->fEpsilon;
      if (pC0->Delay < pC1->Delay - fVar4) {
        return -1;
      }
      if (pC1->Delay + fVar4 < pC0->Delay) {
        return 1;
      }
      if (pC0->Power < pC1->Power - fVar4) {
        return -1;
      }
      if (pC1->Power + fVar4 < pC0->Power) {
        return 1;
      }
      if (pC0->Edge < pC1->Edge - fVar4) {
        return -1;
      }
      if (pC1->Edge + fVar4 < pC0->Edge) {
        return 1;
      }
      fVar5 = pC0->Area;
      fVar6 = pC1->Area;
LAB_0030f17b:
      if (fVar5 < fVar6 - fVar4) {
        return -1;
      }
      if (fVar5 <= fVar4 + fVar6) {
        uVar3 = *(uint *)&pC0->field_0x1c >> 0x18;
        uVar2 = *(uint *)&pC1->field_0x1c >> 0x18;
        if (uVar2 <= uVar3) {
          return (uint)(uVar2 < uVar3);
        }
        return -1;
      }
      return 1;
    }
    if (iVar1 != 1) {
      __assert_fail("p->SortMode == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCut.c"
                    ,0x230,"int If_ManSortCompare(If_Man_t *, If_Cut_t *, If_Cut_t *)");
    }
    fVar4 = p->fEpsilon;
    if (pC0->Area < pC1->Area - fVar4) {
      return -1;
    }
    if (pC1->Area + fVar4 < pC0->Area) {
      return 1;
    }
    if (pC0->Power < pC1->Power - fVar4) {
      return -1;
    }
    if (pC1->Power + fVar4 < pC0->Power) {
      return 1;
    }
    fVar5 = pC0->Edge;
    fVar6 = pC1->Edge;
  }
  if (fVar6 - fVar4 <= fVar5) {
    if (fVar6 + fVar4 < fVar5) {
      return 1;
    }
    uVar2 = *(uint *)&pC0->field_0x1c >> 0x18;
    uVar3 = *(uint *)&pC1->field_0x1c >> 0x18;
    if (uVar3 <= uVar2) {
      if (uVar3 < uVar2) {
        return 1;
      }
      fVar5 = pC0->Delay;
      fVar6 = pC1->Delay;
LAB_0030f233:
      if (fVar6 - fVar4 <= fVar5) {
        return (uint)(fVar4 + fVar6 < fVar5);
      }
      return -1;
    }
  }
  return -1;
}

Assistant:

static inline int If_ManSortCompare( If_Man_t * p, If_Cut_t * pC0, If_Cut_t * pC1 )
{
    if ( p->pPars->fPower )
    {
        if ( p->SortMode == 1 ) // area flow       
        {
            if ( pC0->Area < pC1->Area - p->fEpsilon )
                return -1;
            if ( pC0->Area > pC1->Area + p->fEpsilon )
                return 1;
            //Abc_Print( 1,"area(%.2f, %.2f), power(%.2f, %.2f), edge(%.2f, %.2f)\n",
            //         pC0->Area, pC1->Area, pC0->Power, pC1->Power, pC0->Edge, pC1->Edge);
            if ( pC0->Power < pC1->Power - p->fEpsilon )
                return -1;
            if ( pC0->Power > pC1->Power + p->fEpsilon )
                return 1;
            if ( pC0->Edge < pC1->Edge - p->fEpsilon )
                return -1;
            if ( pC0->Edge > pC1->Edge + p->fEpsilon )
                return 1;
//            if ( pC0->AveRefs > pC1->AveRefs )
//                return -1;
//            if ( pC0->AveRefs < pC1->AveRefs )
//                return 1;
            if ( pC0->nLeaves < pC1->nLeaves )
                return -1;
            if ( pC0->nLeaves > pC1->nLeaves )
                return 1;
            if ( pC0->Delay < pC1->Delay - p->fEpsilon )
                return -1;
            if ( pC0->Delay > pC1->Delay + p->fEpsilon )
                return 1;
            return 0;
        }
        if ( p->SortMode == 0 ) // delay
        {
            if ( pC0->Delay < pC1->Delay - p->fEpsilon )
                return -1;
            if ( pC0->Delay > pC1->Delay + p->fEpsilon )
                return 1;
            if ( pC0->nLeaves < pC1->nLeaves )
                return -1;
            if ( pC0->nLeaves > pC1->nLeaves )
                return 1;
            if ( pC0->Area < pC1->Area - p->fEpsilon )
                return -1;
            if ( pC0->Area > pC1->Area + p->fEpsilon )
                return 1;
            if ( pC0->Power < pC1->Power - p->fEpsilon  )
                return -1;
            if ( pC0->Power > pC1->Power + p->fEpsilon  )
                return 1;
            if ( pC0->Edge < pC1->Edge - p->fEpsilon )
                return -1;
            if ( pC0->Edge > pC1->Edge + p->fEpsilon )
                return 1;
            return 0;
        }
        assert( p->SortMode == 2 ); // delay old, exact area
        if ( pC0->Delay < pC1->Delay - p->fEpsilon )
            return -1;
        if ( pC0->Delay > pC1->Delay + p->fEpsilon )
            return 1;
        if ( pC0->Power < pC1->Power - p->fEpsilon  )
            return -1;
        if ( pC0->Power > pC1->Power + p->fEpsilon  )
            return 1;
        if ( pC0->Edge < pC1->Edge - p->fEpsilon )
            return -1;
        if ( pC0->Edge > pC1->Edge + p->fEpsilon )
            return 1;
        if ( pC0->Area < pC1->Area - p->fEpsilon )
            return -1;
        if ( pC0->Area > pC1->Area + p->fEpsilon )
            return 1;
        if ( pC0->nLeaves < pC1->nLeaves )
            return -1;
        if ( pC0->nLeaves > pC1->nLeaves )
            return 1;
        return 0;
    } 
    else  // regular
    {
        if ( p->SortMode == 1 ) // area
        {
            if ( pC0->Area < pC1->Area - p->fEpsilon )
                return -1;
            if ( pC0->Area > pC1->Area + p->fEpsilon )
                return 1;
            if ( pC0->Edge < pC1->Edge - p->fEpsilon )
                return -1;
            if ( pC0->Edge > pC1->Edge + p->fEpsilon )
                return 1;
            if ( pC0->Power < pC1->Power - p->fEpsilon )
                return -1;
            if ( pC0->Power > pC1->Power + p->fEpsilon )
                return 1;
//            if ( pC0->AveRefs > pC1->AveRefs )
//                return -1;
//            if ( pC0->AveRefs < pC1->AveRefs )
//                return 1;
            if ( pC0->nLeaves < pC1->nLeaves )
                return -1;
            if ( pC0->nLeaves > pC1->nLeaves )
                return 1;
            if ( pC0->Delay < pC1->Delay - p->fEpsilon )
                return -1;
            if ( pC0->Delay > pC1->Delay + p->fEpsilon )
                return 1;
            return 0;
        }
        if ( p->SortMode == 0 ) // delay
        {
            if ( pC0->Delay < pC1->Delay - p->fEpsilon )
                return -1;
            if ( pC0->Delay > pC1->Delay + p->fEpsilon )
                return 1;
            if ( pC0->nLeaves < pC1->nLeaves )
                return -1;
            if ( pC0->nLeaves > pC1->nLeaves )
                return 1;
            if ( pC0->Area < pC1->Area - p->fEpsilon )
                return -1;
            if ( pC0->Area > pC1->Area + p->fEpsilon )
                return 1;
            if ( pC0->Edge < pC1->Edge - p->fEpsilon )
                return -1;
            if ( pC0->Edge > pC1->Edge + p->fEpsilon )
                return 1;
            if ( pC0->Power < pC1->Power - p->fEpsilon )
                return -1;
            if ( pC0->Power > pC1->Power + p->fEpsilon )
                return 1;
            return 0;
        }
        assert( p->SortMode == 2 ); // delay old
        if ( pC0->Delay < pC1->Delay - p->fEpsilon )
            return -1;
        if ( pC0->Delay > pC1->Delay + p->fEpsilon )
            return 1;
        if ( pC0->Area < pC1->Area - p->fEpsilon )
            return -1;
        if ( pC0->Area > pC1->Area + p->fEpsilon )
            return 1;
        if ( pC0->Edge < pC1->Edge - p->fEpsilon )
            return -1;
        if ( pC0->Edge > pC1->Edge + p->fEpsilon )
            return 1;
        if ( pC0->Power < pC1->Power - p->fEpsilon )
            return -1;
        if ( pC0->Power > pC1->Power + p->fEpsilon )
            return 1;
        if ( pC0->nLeaves < pC1->nLeaves )
            return -1;
        if ( pC0->nLeaves > pC1->nLeaves )
            return 1;
        return 0;
    }
}